

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O0

void __thiscall gdsSTR::to_str(gdsSTR *this)

{
  ostream *poVar1;
  void *this_00;
  size_type sVar2;
  reference this_01;
  reference this_02;
  reference this_03;
  reference this_04;
  reference this_05;
  uint local_24;
  uint local_20;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  gdsSTR *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"GDS STR class:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"  Name: ");
  poVar1 = std::operator<<(poVar1,(string *)this);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"  BBox: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->bounding_box[0]);
  std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,this->bounding_box[1]);
  std::operator<<(poVar1,"; ");
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,this->bounding_box[2]);
  std::operator<<(poVar1,", ");
  this_00 = (void *)std::ostream::operator<<(&std::cout,this->bounding_box[3]);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  i_2 = 0;
  while( true ) {
    sVar2 = std::vector<gdsSREF,_std::allocator<gdsSREF>_>::size(&this->SREF);
    if (sVar2 <= i_2) break;
    this_01 = std::vector<gdsSREF,_std::allocator<gdsSREF>_>::operator[](&this->SREF,(ulong)i_2);
    gdsSREF::to_str(this_01);
    i_2 = i_2 + 1;
  }
  i_3 = 0;
  while( true ) {
    sVar2 = std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>::size(&this->BOUNDARY);
    if (sVar2 <= i_3) break;
    this_02 = std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>::operator[]
                        (&this->BOUNDARY,(ulong)i_3);
    gdsBOUNDARY::to_str(this_02);
    i_3 = i_3 + 1;
  }
  i_4 = 0;
  while( true ) {
    sVar2 = std::vector<gdsPATH,_std::allocator<gdsPATH>_>::size(&this->PATH);
    if (sVar2 <= i_4) break;
    this_03 = std::vector<gdsPATH,_std::allocator<gdsPATH>_>::operator[](&this->PATH,(ulong)i_4);
    gdsPATH::to_str(this_03);
    i_4 = i_4 + 1;
  }
  local_20 = 0;
  while( true ) {
    sVar2 = std::vector<gdsNODE,_std::allocator<gdsNODE>_>::size(&this->NODE);
    if (sVar2 <= local_20) break;
    this_04 = std::vector<gdsNODE,_std::allocator<gdsNODE>_>::operator[]
                        (&this->NODE,(ulong)local_20);
    gdsNODE::to_str(this_04);
    local_20 = local_20 + 1;
  }
  local_24 = 0;
  while( true ) {
    sVar2 = std::vector<gdsTEXT,_std::allocator<gdsTEXT>_>::size(&this->TEXT);
    if (sVar2 <= local_24) break;
    this_05 = std::vector<gdsTEXT,_std::allocator<gdsTEXT>_>::operator[]
                        (&this->TEXT,(ulong)local_24);
    gdsTEXT::to_str(this_05);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void gdsSTR::to_str()
{
  cout << "GDS STR class:" << endl;

  cout << "  Name: " << this->name << endl;

  cout << "  BBox: " << bounding_box[0] << ", ";
  cout << bounding_box[1] << "; ";
  cout << bounding_box[2] << ", ";
  cout << bounding_box[3] << endl;

  for (unsigned int i = 0; i < this->SREF.size(); i++) {
    this->SREF[i].to_str();
  }

  for (unsigned int i = 0; i < this->BOUNDARY.size(); i++) {
    this->BOUNDARY[i].to_str();
  }

  for (unsigned int i = 0; i < this->PATH.size(); i++) {
    this->PATH[i].to_str();
  }

  for (unsigned int i = 0; i < this->NODE.size(); i++) {
    this->NODE[i].to_str();
  }

  for (unsigned int i = 0; i < this->TEXT.size(); i++) {
    this->TEXT[i].to_str();
  }
}